

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::QPDFDictItems::iterator::Members::Members
          (Members *this,QPDFObjectHandle *oh,bool for_begin)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  this->oh = oh;
  p_Var2 = &(this->keys)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->iter)._M_node = (_Base_ptr)0x0;
  getKeys_abi_cxx11_((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_50,oh);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->keys)._M_t);
  if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_50._M_impl.super__Rb_tree_header;
    (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_50._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var2;
    (this->keys)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_50._M_impl.super__Rb_tree_header._M_node_count;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  if (for_begin) {
    p_Var2 = (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (this->iter)._M_node = p_Var2;
  return;
}

Assistant:

QPDFObjectHandle::QPDFDictItems::iterator::Members::Members(QPDFObjectHandle& oh, bool for_begin) :
    oh(oh)
{
    this->keys = oh.getKeys();
    this->iter = for_begin ? this->keys.begin() : this->keys.end();
}